

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formular_inline.h
# Opt level: O0

float formularAllShipAtk(int *shipAtk)

{
  int iVar1;
  reference pvVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  __type _Var6;
  int local_18;
  int rawDamage;
  int i;
  float res;
  int *shipAtk_local;
  
  rawDamage = 0;
  for (local_18 = 0; local_18 < carrierNum; local_18 = local_18 + 1) {
    if (shipAtk[local_18] != 0) {
      iVar1 = shipAtk[local_18];
      pvVar2 = std::vector<Carrier,_std::allocator<Carrier>_>::operator[]
                         (&theCarrier,(long)local_18);
      iVar1 = formula_shipAtk_rawDamage(iVar1,pvVar2->atk);
      fVar3 = formula_shipAtk_cocurHeading(iVar1);
      fVar3 = armorSimu((int)fVar3);
      fVar4 = formula_shipAtk_invertHeading(iVar1);
      fVar4 = armorSimu((int)fVar4);
      dVar5 = (double)accu_coef;
      _Var6 = std::sqrt<int>(local_18);
      rawDamage = (int)(float)(((double)fVar3 * 0.6 + (double)fVar4 * 0.4) * (dVar5 * _Var6 + 1.0) +
                              (double)(float)rawDamage);
    }
  }
  return (float)rawDamage;
}

Assistant:

inline float formularAllShipAtk(int shipAtk[]){
    float res=0;
    for(int i=0;i<carrierNum;i++){
        if(shipAtk[i] == 0) continue;//��վ
        int rawDamage = formula_shipAtk_rawDamage(shipAtk[i], theCarrier[i].atk);
        res += (armorSimu(formula_shipAtk_cocurHeading(rawDamage))*0.6 + armorSimu(formula_shipAtk_invertHeading(rawDamage))*0.4) * (1+accu_coef*sqrt(i));
    }
    return res;
}